

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int nghttp2_http_on_request_headers(nghttp2_stream *stream,nghttp2_frame *frame)

{
  int iVar1;
  nghttp2_frame *frame_local;
  nghttp2_stream *stream_local;
  
  if (((stream->http_flags & 0x8000) == 0) && ((stream->http_flags & 0x80) != 0)) {
    if (((stream->http_flags & 10) != 0) || ((stream->http_flags & 1) == 0)) {
      return -1;
    }
    stream->content_length = -1;
  }
  else {
    if (((stream->http_flags & 0xe) != 0xe) || ((stream->http_flags & 0x11) == 0)) {
      return -1;
    }
    if (((stream->http_flags & 0x8000) != 0) &&
       (((stream->http_flags & 0x80) == 0 || ((stream->http_flags & 1) == 0)))) {
      return -1;
    }
    iVar1 = check_path(stream);
    if (iVar1 == 0) {
      return -1;
    }
  }
  if ((frame->hd).type == '\x05') {
    stream->http_flags = stream->http_flags & 0x780;
    stream->content_length = -1;
  }
  return 0;
}

Assistant:

int nghttp2_http_on_request_headers(nghttp2_stream *stream,
                                    nghttp2_frame *frame) {
  if (!(stream->http_flags & NGHTTP2_HTTP_FLAG__PROTOCOL) &&
      (stream->http_flags & NGHTTP2_HTTP_FLAG_METH_CONNECT)) {
    if ((stream->http_flags &
         (NGHTTP2_HTTP_FLAG__SCHEME | NGHTTP2_HTTP_FLAG__PATH)) ||
        (stream->http_flags & NGHTTP2_HTTP_FLAG__AUTHORITY) == 0) {
      return -1;
    }
    stream->content_length = -1;
  } else {
    if ((stream->http_flags & NGHTTP2_HTTP_FLAG_REQ_HEADERS) !=
            NGHTTP2_HTTP_FLAG_REQ_HEADERS ||
        (stream->http_flags &
         (NGHTTP2_HTTP_FLAG__AUTHORITY | NGHTTP2_HTTP_FLAG_HOST)) == 0) {
      return -1;
    }
    if ((stream->http_flags & NGHTTP2_HTTP_FLAG__PROTOCOL) &&
        ((stream->http_flags & NGHTTP2_HTTP_FLAG_METH_CONNECT) == 0 ||
         (stream->http_flags & NGHTTP2_HTTP_FLAG__AUTHORITY) == 0)) {
      return -1;
    }
    if (!check_path(stream)) {
      return -1;
    }
  }

  if (frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    /* we are going to reuse data fields for upcoming response.  Clear
       them now, except for method flags. */
    stream->http_flags &= NGHTTP2_HTTP_FLAG_METH_ALL;
    stream->content_length = -1;
  }

  return 0;
}